

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_settings.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_settings::set_bool(session_settings *this,int name,bool value)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  
  ::std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->m_mutex);
  session_settings_single_thread::set_bool(&this->m_store,name,value);
  ::std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void set_bool(int name, bool value) override
		{
			std::unique_lock<std::mutex> l(m_mutex);
			m_store.set_bool(name, value);
		}